

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::initTestIteration
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLenum framebuffer_status;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  Functions *gl;
  GLuint test_index_local;
  TextureCubeMapArrayStencilAttachments *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar7 + 0x6f8))(1,&this->m_texture_cube_array_color_id);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Could not generate texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2fd);
  (**(code **)(lVar7 + 0xb8))(0x9009,this->m_texture_cube_array_color_id);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Could not bind a texture object to GL_TEXTURE_CUBE_MAP_ARRAY_EXT target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x300);
  if (this->m_immutable_storage == '\0') {
    createMutableCubeArrayColor(this,test_index);
  }
  else {
    createImmutableCubeArrayColor(this,test_index);
  }
  (**(code **)(lVar7 + 0x6f8))(1,&this->m_texture_cube_array_stencil_id);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Could not generate texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x30d);
  (**(code **)(lVar7 + 0xb8))(0x9009,this->m_texture_cube_array_stencil_id);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Could not bind texture object to GL_TEXTURE_CUBE_MAP_ARRAY_EXT target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x310);
  if (this->m_immutable_storage == '\0') {
    createMutableCubeArrayStencil(this,test_index);
  }
  else {
    createImmutableCubeArrayStencil(this,test_index);
  }
  (**(code **)(lVar7 + 0x78))(0x8ca9,this->m_fbo_draw_id);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Could not bind draw framebuffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x31d);
  pcVar1 = *(code **)(lVar7 + 0x1a00);
  GVar4 = CubeMapArrayDataStorage::getWidth(this->m_cube_map_array_data + test_index);
  GVar5 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
  (*pcVar1)(0,0,GVar4,GVar5);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Could not set viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,800);
  if (this->m_fbo_layered == '\0') {
    setupNonLayeredFramebuffer(this);
  }
  else {
    setupLayeredFramebuffer(this);
  }
  framebuffer_status = (**(code **)(lVar7 + 0x170))(0x8ca9);
  checkFramebufferStatus(this,framebuffer_status);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::initTestIteration(glw::GLuint test_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up texture storage for color data */
	gl.genTextures(1, &m_texture_cube_array_color_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate texture object!");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_texture_cube_array_color_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a texture object to GL_TEXTURE_CUBE_MAP_ARRAY_EXT target");

	if (m_immutable_storage)
	{
		createImmutableCubeArrayColor(test_index);
	}
	else
	{
		createMutableCubeArrayColor(test_index);
	}

	/* Set up texture storage for stencil data */
	gl.genTextures(1, &m_texture_cube_array_stencil_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate texture object!");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_texture_cube_array_stencil_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind texture object to GL_TEXTURE_CUBE_MAP_ARRAY_EXT target");

	if (m_immutable_storage)
	{
		createImmutableCubeArrayStencil(test_index);
	}
	else
	{
		createMutableCubeArrayStencil(test_index);
	}

	/* Set up the draw framebuffer */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_draw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind draw framebuffer!");

	gl.viewport(0, 0, m_cube_map_array_data[test_index].getWidth(), m_cube_map_array_data[test_index].getHeight());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set viewport");

	if (m_fbo_layered)
	{
		setupLayeredFramebuffer();
	}
	else
	{
		setupNonLayeredFramebuffer();
	}

	/* Is the draw FBO complete, now that we're done with configuring it? */
	checkFramebufferStatus(gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER));
}